

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subprocess.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::Subprocess::Start
          (Subprocess *this,string *program,SearchMode search_mode)

{
  int iVar1;
  __pid_t _Var2;
  char *pcVar3;
  LogMessage *pLVar4;
  int *piVar5;
  size_t sVar6;
  ssize_t sVar7;
  char *message;
  int ignored;
  char *local_d8;
  char *argv [2];
  LogFinisher local_ba;
  byte local_b9;
  LogMessage local_b8;
  LogFinisher local_7d [20];
  byte local_69;
  LogMessage local_68;
  int local_2c;
  int local_28;
  int stdout_pipe [2];
  int stdin_pipe [2];
  SearchMode search_mode_local;
  string *program_local;
  Subprocess *this_local;
  
  iVar1 = pipe(stdout_pipe);
  local_69 = 0;
  if (iVar1 == -1) {
    internal::LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/compiler/subprocess.cc"
               ,299);
    local_69 = 1;
    pLVar4 = internal::LogMessage::operator<<(&local_68,"CHECK failed: pipe(stdin_pipe) != -1: ");
    internal::LogFinisher::operator=(local_7d,pLVar4);
  }
  if ((local_69 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_68);
  }
  iVar1 = pipe(&local_2c);
  local_b9 = 0;
  if (iVar1 == -1) {
    internal::LogMessage::LogMessage
              (&local_b8,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/compiler/subprocess.cc"
               ,300);
    local_b9 = 1;
    pLVar4 = internal::LogMessage::operator<<(&local_b8,"CHECK failed: pipe(stdout_pipe) != -1: ");
    internal::LogFinisher::operator=(&local_ba,pLVar4);
  }
  if ((local_b9 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_b8);
  }
  pcVar3 = (char *)std::__cxx11::string::c_str();
  local_d8 = strdup(pcVar3);
  argv[0] = (char *)0x0;
  _Var2 = fork();
  this->child_pid_ = _Var2;
  if (this->child_pid_ == -1) {
    internal::LogMessage::LogMessage
              ((LogMessage *)&ignored,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/compiler/subprocess.cc"
               ,0x132);
    pLVar4 = internal::LogMessage::operator<<((LogMessage *)&ignored,"fork: ");
    piVar5 = __errno_location();
    pcVar3 = strerror(*piVar5);
    pLVar4 = internal::LogMessage::operator<<(pLVar4,pcVar3);
    internal::LogFinisher::operator=((LogFinisher *)((long)&message + 7),pLVar4);
    internal::LogMessage::~LogMessage((LogMessage *)&ignored);
  }
  else {
    if (this->child_pid_ == 0) {
      dup2(stdout_pipe[0],0);
      dup2(local_28,1);
      close(stdout_pipe[0]);
      close(stdout_pipe[1]);
      close(local_2c);
      close(local_28);
      if (search_mode == SEARCH_PATH) {
        execvp(local_d8,&local_d8);
      }
      else if (search_mode == EXACT_NAME) {
        execv(local_d8,&local_d8);
      }
      pcVar3 = local_d8;
      sVar6 = strlen(local_d8);
      sVar7 = write(2,pcVar3,sVar6);
      message._0_4_ = (undefined4)sVar7;
      sVar6 = strlen(": program not found or is not executable\n");
      sVar7 = write(2,": program not found or is not executable\n",sVar6);
      message._0_4_ = (undefined4)sVar7;
      _exit(1);
    }
    free(local_d8);
    close(stdout_pipe[0]);
    close(local_28);
    this->child_stdin_ = stdout_pipe[1];
    this->child_stdout_ = local_2c;
  }
  return;
}

Assistant:

void Subprocess::Start(const string& program, SearchMode search_mode) {
  // Note that we assume that there are no other threads, thus we don't have to
  // do crazy stuff like using socket pairs or avoiding libc locks.

  // [0] is read end, [1] is write end.
  int stdin_pipe[2];
  int stdout_pipe[2];

  GOOGLE_CHECK(pipe(stdin_pipe) != -1);
  GOOGLE_CHECK(pipe(stdout_pipe) != -1);

  char* argv[2] = { strdup(program.c_str()), NULL };

  child_pid_ = fork();
  if (child_pid_ == -1) {
    GOOGLE_LOG(FATAL) << "fork: " << strerror(errno);
  } else if (child_pid_ == 0) {
    // We are the child.
    dup2(stdin_pipe[0], STDIN_FILENO);
    dup2(stdout_pipe[1], STDOUT_FILENO);

    close(stdin_pipe[0]);
    close(stdin_pipe[1]);
    close(stdout_pipe[0]);
    close(stdout_pipe[1]);

    switch (search_mode) {
      case SEARCH_PATH:
        execvp(argv[0], argv);
        break;
      case EXACT_NAME:
        execv(argv[0], argv);
        break;
    }

    // Write directly to STDERR_FILENO to avoid stdio code paths that may do
    // stuff that is unsafe here.
    int ignored;
    ignored = write(STDERR_FILENO, argv[0], strlen(argv[0]));
    const char* message = ": program not found or is not executable\n";
    ignored = write(STDERR_FILENO, message, strlen(message));
    (void) ignored;

    // Must use _exit() rather than exit() to avoid flushing output buffers
    // that will also be flushed by the parent.
    _exit(1);
  } else {
    free(argv[0]);

    close(stdin_pipe[0]);
    close(stdout_pipe[1]);

    child_stdin_ = stdin_pipe[1];
    child_stdout_ = stdout_pipe[0];
  }
}